

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O0

void __thiscall iutest::any::any(any *this,char *rhs)

{
  char *__s;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *rhs_local;
  any *this_local;
  
  local_18 = rhs;
  rhs_local = (char *)this;
  this_00 = (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::holder
            (this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this->content = (placeholder *)this_00;
  return;
}

Assistant:

any(const char rhs[]) : content(new holder< ::std::string >(::std::string(rhs)) ) {}